

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
ProcessorGenerator::ProcessorGenerator
          (ProcessorGenerator *this,t_cpp_generator *generator,t_service *service,string *style)

{
  pointer pcVar1;
  t_service *ttype;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  long *plVar5;
  ofstream_with_content_based_conditional_update *poVar6;
  string *psVar7;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  string *local_180;
  string *local_178;
  string *local_170;
  string *local_168;
  string *local_160;
  string *local_158;
  string *local_150;
  string *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  string *local_130;
  string *local_128;
  string *local_120;
  string *local_118;
  string *local_110;
  string *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  this->generator_ = generator;
  this->service_ = service;
  this->f_header_ = (ostream *)&generator->f_header_;
  poVar6 = &generator->f_service_tcc_;
  if (generator->gen_templates_ == false) {
    poVar6 = &generator->f_service_;
  }
  this->f_out_ = (ostream *)poVar6;
  local_138 = &this->service_name_;
  local_58 = &(this->service_name_).field_2;
  (this->service_name_)._M_dataplus._M_p = (pointer)local_58;
  pcVar1 = (generator->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_138,pcVar1,
             pcVar1 + (generator->super_t_oop_generator).super_t_generator.service_name_.
                      _M_string_length);
  local_60 = &(this->style_).field_2;
  (this->style_)._M_dataplus._M_p = (pointer)local_60;
  pcVar1 = (style->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->style_,pcVar1,pcVar1 + style->_M_string_length);
  local_68 = &(this->pstyle_).field_2;
  (this->pstyle_)._M_dataplus._M_p = (pointer)local_68;
  (this->pstyle_)._M_string_length = 0;
  (this->pstyle_).field_2._M_local_buf[0] = '\0';
  local_70 = &(this->class_name_).field_2;
  (this->class_name_)._M_dataplus._M_p = (pointer)local_70;
  (this->class_name_)._M_string_length = 0;
  (this->class_name_).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->if_name_).field_2;
  (this->if_name_)._M_dataplus._M_p = (pointer)local_78;
  (this->if_name_)._M_string_length = 0;
  (this->if_name_).field_2._M_local_buf[0] = '\0';
  local_80 = &(this->factory_class_name_).field_2;
  (this->factory_class_name_)._M_dataplus._M_p = (pointer)local_80;
  (this->factory_class_name_)._M_string_length = 0;
  (this->factory_class_name_).field_2._M_local_buf[0] = '\0';
  local_88 = &(this->finish_cob_).field_2;
  (this->finish_cob_)._M_dataplus._M_p = (pointer)local_88;
  (this->finish_cob_)._M_string_length = 0;
  (this->finish_cob_).field_2._M_local_buf[0] = '\0';
  local_90 = &(this->finish_cob_decl_).field_2;
  (this->finish_cob_decl_)._M_dataplus._M_p = (pointer)local_90;
  (this->finish_cob_decl_)._M_string_length = 0;
  (this->finish_cob_decl_).field_2._M_local_buf[0] = '\0';
  local_98 = &(this->ret_type_).field_2;
  (this->ret_type_)._M_dataplus._M_p = (pointer)local_98;
  (this->ret_type_)._M_string_length = 0;
  (this->ret_type_).field_2._M_local_buf[0] = '\0';
  local_a0 = &(this->call_context_).field_2;
  (this->call_context_)._M_dataplus._M_p = (pointer)local_a0;
  (this->call_context_)._M_string_length = 0;
  (this->call_context_).field_2._M_local_buf[0] = '\0';
  local_a8 = &(this->cob_arg_).field_2;
  (this->cob_arg_)._M_dataplus._M_p = (pointer)local_a8;
  (this->cob_arg_)._M_string_length = 0;
  (this->cob_arg_).field_2._M_local_buf[0] = '\0';
  local_b0 = &(this->call_context_arg_).field_2;
  (this->call_context_arg_)._M_dataplus._M_p = (pointer)local_b0;
  (this->call_context_arg_)._M_string_length = 0;
  (this->call_context_arg_).field_2._M_local_buf[0] = '\0';
  local_b8 = &(this->call_context_decl_).field_2;
  (this->call_context_decl_)._M_dataplus._M_p = (pointer)local_b8;
  (this->call_context_decl_)._M_string_length = 0;
  (this->call_context_decl_).field_2._M_local_buf[0] = '\0';
  local_c0 = &(this->template_header_).field_2;
  (this->template_header_)._M_dataplus._M_p = (pointer)local_c0;
  (this->template_header_)._M_string_length = 0;
  (this->template_header_).field_2._M_local_buf[0] = '\0';
  local_c8 = &(this->template_suffix_).field_2;
  (this->template_suffix_)._M_dataplus._M_p = (pointer)local_c8;
  (this->template_suffix_)._M_string_length = 0;
  (this->template_suffix_).field_2._M_local_buf[0] = '\0';
  local_d0 = &(this->typename_str_).field_2;
  (this->typename_str_)._M_dataplus._M_p = (pointer)local_d0;
  (this->typename_str_)._M_string_length = 0;
  (this->typename_str_).field_2._M_local_buf[0] = '\0';
  local_d8 = &(this->class_suffix_).field_2;
  (this->class_suffix_)._M_dataplus._M_p = (pointer)local_d8;
  (this->class_suffix_)._M_string_length = 0;
  (this->class_suffix_).field_2._M_local_buf[0] = '\0';
  local_e0 = &(this->extends_).field_2;
  (this->extends_)._M_dataplus._M_p = (pointer)local_e0;
  (this->extends_)._M_string_length = 0;
  (this->extends_).field_2._M_local_buf[0] = '\0';
  psVar7 = &this->pstyle_;
  local_180 = (string *)&this->class_name_;
  local_168 = (string *)&this->if_name_;
  local_160 = (string *)&this->factory_class_name_;
  local_148 = &this->finish_cob_;
  local_150 = &this->finish_cob_decl_;
  local_170 = &this->ret_type_;
  psVar8 = &(this->ret_type_)._M_string_length;
  local_108 = &this->call_context_;
  local_158 = &this->cob_arg_;
  local_110 = &this->call_context_arg_;
  local_118 = &this->call_context_decl_;
  local_120 = &this->template_header_;
  local_128 = &this->template_suffix_;
  local_130 = &this->typename_str_;
  local_178 = (string *)&this->extends_;
  iVar2 = std::__cxx11::string::compare((char *)&this->style_);
  local_140 = psVar7;
  if (iVar2 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)psVar7,0,(char *)(this->pstyle_)._M_string_length,0x3861cf);
    std::operator+(&local_100,local_138,local_140);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_190 = *plVar5;
      lStack_188 = plVar3[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar5;
      local_1a0 = (long *)*plVar3;
    }
    local_198 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=(local_180,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    pcVar1 = (this->service_name_)._M_dataplus._M_p;
    local_1a0 = &local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,pcVar1,pcVar1 + (this->service_name_)._M_string_length);
    std::__cxx11::string::append((char *)&local_1a0);
    std::__cxx11::string::operator=(local_168,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0);
    }
    std::__cxx11::string::_M_replace
              ((ulong)local_148,0,(char *)(this->finish_cob_)._M_string_length,0x381706);
    std::__cxx11::string::_M_replace
              ((ulong)local_150,0,(char *)(this->finish_cob_decl_)._M_string_length,0x38172b);
    std::__cxx11::string::_M_replace
              ((ulong)local_158,0,(char *)(this->cob_arg_)._M_string_length,0x381725);
    pcVar4 = "void ";
    psVar7 = local_170;
  }
  else {
    pcVar1 = (this->service_name_)._M_dataplus._M_p;
    local_1a0 = &local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,pcVar1,pcVar1 + (this->service_name_)._M_string_length);
    std::__cxx11::string::append((char *)&local_1a0);
    std::__cxx11::string::operator=(local_180,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0);
    }
    pcVar1 = (this->service_name_)._M_dataplus._M_p;
    local_1a0 = &local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,pcVar1,pcVar1 + (this->service_name_)._M_string_length);
    std::__cxx11::string::append((char *)&local_1a0);
    std::__cxx11::string::operator=(local_168,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0);
    }
    std::__cxx11::string::_M_replace((ulong)local_170,0,(char *)*psVar8,0x39cd82);
    std::__cxx11::string::_M_replace
              ((ulong)local_108,0,(char *)(this->call_context_)._M_string_length,0x38174c);
    std::__cxx11::string::_M_replace
              ((ulong)local_110,0,(char *)(this->call_context_arg_)._M_string_length,0x381760);
    psVar8 = &(this->call_context_decl_)._M_string_length;
    pcVar4 = ", void*";
    psVar7 = local_118;
  }
  std::__cxx11::string::_M_replace((ulong)psVar7,0,(char *)*psVar8,(ulong)pcVar4);
  pcVar1 = (this->class_name_)._M_dataplus._M_p;
  local_1a0 = &local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar1,pcVar1 + (this->class_name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_1a0);
  std::__cxx11::string::operator=(local_160,(string *)&local_1a0);
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if (generator->gen_templates_ == true) {
    std::__cxx11::string::_M_replace
              ((ulong)local_120,0,(char *)(this->template_header_)._M_string_length,0x38076e);
    std::__cxx11::string::_M_replace
              ((ulong)local_128,0,(char *)(this->template_suffix_)._M_string_length,0x37fe86);
    std::__cxx11::string::_M_replace
              ((ulong)local_130,0,(char *)(this->typename_str_)._M_string_length,0x381776);
    std::__cxx11::string::append((char *)local_180);
    std::__cxx11::string::append((char *)local_160);
  }
  ttype = this->service_->extends_;
  if (ttype != (t_service *)0x0) {
    t_cpp_generator::type_name_abi_cxx11_
              (&local_50,this->generator_,&ttype->super_t_type,false,false);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,(ulong)(this->pstyle_)._M_dataplus._M_p);
    psVar8 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_100.field_2._M_allocated_capacity = *psVar8;
      local_100.field_2._8_8_ = plVar3[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar8;
      local_100._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_100._M_string_length = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_190 = *plVar5;
      lStack_188 = plVar3[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar5;
      local_1a0 = (long *)*plVar3;
    }
    local_198 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=(local_178,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (this->generator_->gen_templates_ == true) {
      std::__cxx11::string::append((char *)local_178);
    }
  }
  return;
}

Assistant:

ProcessorGenerator::ProcessorGenerator(t_cpp_generator* generator,
                                       t_service* service,
                                       const string& style)
  : generator_(generator),
    service_(service),
    f_header_(generator->f_header_),
    f_out_(generator->gen_templates_ ? generator->f_service_tcc_ : generator->f_service_),
    service_name_(generator->service_name_),
    style_(style) {
  if (style_ == "Cob") {
    pstyle_ = "Async";
    class_name_ = service_name_ + pstyle_ + "Processor";
    if_name_ = service_name_ + "CobSvIf";

    finish_cob_ = "::std::function<void(bool ok)> cob, ";
    finish_cob_decl_ = "::std::function<void(bool ok)>, ";
    cob_arg_ = "cob, ";
    ret_type_ = "void ";
  } else {
    class_name_ = service_name_ + "Processor";
    if_name_ = service_name_ + "If";

    ret_type_ = "bool ";
    // TODO(edhall) callContext should eventually be added to TAsyncProcessor
    call_context_ = ", void* callContext";
    call_context_arg_ = ", callContext";
    call_context_decl_ = ", void*";
  }

  factory_class_name_ = class_name_ + "Factory";

  if (generator->gen_templates_) {
    template_header_ = "template <class Protocol_>\n";
    template_suffix_ = "<Protocol_>";
    typename_str_ = "typename ";
    class_name_ += "T";
    factory_class_name_ += "T";
  }

  if (service_->get_extends() != nullptr) {
    extends_ = type_name(service_->get_extends()) + pstyle_ + "Processor";
    if (generator_->gen_templates_) {
      // TODO(simpkins): If gen_templates_ is enabled, we currently assume all
      // parent services were also generated with templates enabled.
      extends_ += "T<Protocol_>";
    }
  }
}